

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

iterator llvm::skipLeadingZeroesAndAnyDot(iterator begin,iterator end,iterator *dot)

{
  bool bVar1;
  char *local_28;
  iterator p;
  iterator *dot_local;
  iterator end_local;
  iterator begin_local;
  
  *dot = end;
  local_28 = begin;
  while( true ) {
    bVar1 = false;
    if (local_28 != end) {
      bVar1 = *local_28 == '0';
    }
    if (!bVar1) break;
    local_28 = local_28 + 1;
  }
  if ((local_28 != end) && (*local_28 == '.')) {
    *dot = local_28;
    if ((long)end - (long)begin == 1) {
      __assert_fail("end - begin != 1 && \"Significand has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,299,
                    "StringRef::iterator llvm::skipLeadingZeroesAndAnyDot(StringRef::iterator, StringRef::iterator, StringRef::iterator *)"
                   );
    }
    do {
      local_28 = local_28 + 1;
      bVar1 = false;
      if (local_28 != end) {
        bVar1 = *local_28 == '0';
      }
    } while (bVar1);
  }
  return local_28;
}

Assistant:

static StringRef::iterator
skipLeadingZeroesAndAnyDot(StringRef::iterator begin, StringRef::iterator end,
                           StringRef::iterator *dot)
{
  StringRef::iterator p = begin;
  *dot = end;
  while (p != end && *p == '0')
    p++;

  if (p != end && *p == '.') {
    *dot = p++;

    assert(end - begin != 1 && "Significand has no digits");

    while (p != end && *p == '0')
      p++;
  }

  return p;
}